

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction.cpp
# Opt level: O2

Transaction * __thiscall
cfd::core::Transaction::operator=(Transaction *this,Transaction *transaction)

{
  string local_30;
  
  if (this != transaction) {
    AbstractTransaction::GetHex_abi_cxx11_(&local_30,&transaction->super_AbstractTransaction);
    SetFromHex(this,&local_30);
    ::std::__cxx11::string::~string((string *)&local_30);
  }
  return this;
}

Assistant:

Transaction &Transaction::operator=(const Transaction &transaction) & {
  if (this != &transaction) {
    SetFromHex(transaction.GetHex());
  }
  return *this;
}